

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter.h
# Opt level: O0

void init_token_stats(TOKEN_STATS *token_stats)

{
  TOKEN_STATS *token_stats_local;
  
  token_stats->cost = 0;
  return;
}

Assistant:

static inline void init_token_stats(TOKEN_STATS *token_stats) {
#if CONFIG_RD_DEBUG
  int r, c;
  for (r = 0; r < TXB_COEFF_COST_MAP_SIZE; ++r) {
    for (c = 0; c < TXB_COEFF_COST_MAP_SIZE; ++c) {
      token_stats->txb_coeff_cost_map[r][c] = 0;
    }
  }
#endif
  token_stats->cost = 0;
}